

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall Quat4f::normalized(Quat4f *this)

{
  float *in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Quat4f QVar1;
  
  this->m_elements[0] = *in_RSI;
  this->m_elements[1] = in_RSI[1];
  this->m_elements[2] = in_RSI[2];
  this->m_elements[3] = in_RSI[3];
  normalize(this);
  QVar1.m_elements[2] = (float)(int)in_XMM1_Qa;
  QVar1.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  QVar1.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar1.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::normalized() const
{
	Quat4f q( *this );
	q.normalize();
	return q;
}